

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::~CTcTokenizer(CTcTokenizer *this)

{
  uint *puVar1;
  CTcTokFileDesc *pCVar2;
  CTcTokenEle *pCVar3;
  CCharmapToUni *pCVar4;
  tctok_incfile_t *ptVar5;
  tctok_incpath_t *ptVar6;
  char *pcVar7;
  CTcMacroRsc *pCVar8;
  CTcTokSrcBlock *this_00;
  CVmHashTable *pCVar9;
  CCharmapToLocal *pCVar10;
  CTcTokFileDesc *this_01;
  CTcTokenEle *pCVar11;
  tctok_incfile_t *__ptr;
  tctok_incpath_t *__ptr_00;
  CTcMacroRsc *pCVar12;
  
  delete_source(this);
  if (this->string_fp_ != (CVmDataSource *)0x0) {
    (*this->string_fp_->_vptr_CVmDataSource[1])();
  }
  this_01 = this->desc_head_;
  while (this_01 != (CTcTokFileDesc *)0x0) {
    pCVar2 = this_01->next_;
    CTcTokFileDesc::~CTcTokFileDesc(this_01);
    operator_delete(this_01,0x58);
    this->desc_head_ = pCVar2;
    this_01 = pCVar2;
  }
  this->unget_cur_ = (CTcTokenEle *)0x0;
  pCVar11 = this->unget_head_;
  while (pCVar11 != (CTcTokenEle *)0x0) {
    pCVar3 = pCVar11->nxt_;
    operator_delete(pCVar11,0x38);
    this->unget_head_ = pCVar3;
    pCVar11 = pCVar3;
  }
  if (this->desc_list_ != (CTcTokFileDesc **)0x0) {
    free(this->desc_list_);
  }
  lib_free_str(this->default_charset_);
  pCVar4 = this->default_mapper_;
  puVar1 = &(pCVar4->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar4->super_CCharmap)._vptr_CCharmap[1])();
  }
  __ptr = this->prev_includes_;
  while (__ptr != (tctok_incfile_t *)0x0) {
    ptVar5 = __ptr->nxt;
    free(__ptr);
    this->prev_includes_ = ptVar5;
    __ptr = ptVar5;
  }
  __ptr_00 = this->incpath_head_;
  while (__ptr_00 != (tctok_incpath_t *)0x0) {
    ptVar6 = __ptr_00->nxt;
    free(__ptr_00);
    this->incpath_head_ = ptVar6;
    __ptr_00 = ptVar6;
  }
  pCVar12 = this->macro_res_head_;
  while (pCVar12 != (CTcMacroRsc *)0x0) {
    pcVar7 = (pCVar12->actual_exp_buf_).buf_;
    pCVar8 = pCVar12->next_;
    (pCVar12->actual_exp_buf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
    }
    (pCVar12->macro_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
    pcVar7 = (pCVar12->macro_exp_).buf_;
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
    }
    (pCVar12->line_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
    pcVar7 = (pCVar12->line_exp_).buf_;
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
    }
    operator_delete(pCVar12,0x70);
    this->macro_res_head_ = pCVar8;
    pCVar12 = pCVar8;
  }
  this_00 = this->src_head_;
  if (this_00 != (CTcTokSrcBlock *)0x0) {
    CTcTokSrcBlock::~CTcTokSrcBlock(this_00);
    operator_delete(this_00,0xc358);
  }
  if (this->defines_ != (CTcMacroTable *)0x0) {
    (*this->defines_->_vptr_CTcMacroTable[1])();
  }
  pCVar9 = this->undefs_;
  if (pCVar9 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar9);
    operator_delete(pCVar9,0x20);
  }
  pCVar9 = this->kw_;
  if (pCVar9 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar9);
    operator_delete(pCVar9,0x20);
  }
  pCVar10 = this->string_fp_map_;
  if (pCVar10 != (CCharmapToLocal *)0x0) {
    puVar1 = &(pCVar10->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pCVar10->super_CCharmap)._vptr_CCharmap[1])();
    }
  }
  (this->defbuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
  pcVar7 = (this->defbuf_).buf_;
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
  }
  (this->expbuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
  pcVar7 = (this->expbuf_).buf_;
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
  }
  (this->unsplicebuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
  pcVar7 = (this->unsplicebuf_).buf_;
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
  }
  (this->linebuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00324918;
  pcVar7 = (this->linebuf_).buf_;
  if (pcVar7 == (char *)0x0) {
    return;
  }
  free(pcVar7);
  return;
}

Assistant:

CTcTokenizer::~CTcTokenizer()
{
    /* delete all streams */
    delete_source();

    /* delete the string capture file */
    if (string_fp_ != 0)
        delete string_fp_;

    /* delete all file descriptors */
    while (desc_head_ != 0)
    {
        /* remember the next descriptor */
        CTcTokFileDesc *nxt = desc_head_->get_next();

        /* delete this one */
        delete desc_head_;

        /* move on to the next one */
        desc_head_ = nxt;
    }

    /* delete the unget list */
    unget_cur_ = 0;
    while (unget_head_ != 0)
    {
        /* remember the next element */
        CTcTokenEle *nxt = unget_head_->getnxt();

        /* delete this element */
        delete unget_head_;

        /* advance to the next element */
        unget_head_ = nxt;
    }

    /* delete the file descriptor index array */
    if (desc_list_ != 0)
        t3free(desc_list_);

    /* delete our default character set string copy */
    lib_free_str(default_charset_);

    /* release our reference on our default character mapper */
    default_mapper_->release_ref();

    /* forget about all of our previous include files */
    while (prev_includes_ != 0)
    {
        tctok_incfile_t *nxt;

        /* remember the next file */
        nxt = prev_includes_->nxt;

        /* delete this one */
        t3free(prev_includes_);

        /* move on to the next one */
        prev_includes_ = nxt;
    }

    /* delete the include path list */
    while (incpath_head_ != 0)
    {
        tctok_incpath_t *nxt;

        /* remember the next entry in the path */
        nxt = incpath_head_->nxt;

        /* delete this entry */
        t3free(incpath_head_);

        /* move on to the next one */
        incpath_head_ = nxt;
    }

    /* delete the macro resources */
    while (macro_res_head_ != 0)
    {
        CTcMacroRsc *nxt;

        /* remember the next one */
        nxt = macro_res_head_->next_;

        /* delete this one */
        delete macro_res_head_;

        /* move on to the next one */
        macro_res_head_ = nxt;
    }

    /* delete the token list */
    delete src_head_;

    /* delete the #define and #undef symbol tables */
    delete defines_;
    delete undefs_;

    /* delete the keyword hash table */
    delete kw_;

    /* if we created a mapping for the string capture file, release it */
    if (string_fp_map_ != 0)
        string_fp_map_->release_ref();
}